

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

int __thiscall ImFontAtlas::AddCustomRectRegular(ImFontAtlas *this,int width,int height)

{
  int in_EDX;
  int in_ESI;
  ImFontAtlasCustomRect *in_RDI;
  ImFontAtlasCustomRect r;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar1;
  
  if (in_ESI < 1 || 0xffff < in_ESI) {
    __assert_fail("width > 0 && width <= 0xFFFF",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x726,"int ImFontAtlas::AddCustomRectRegular(int, int)");
  }
  uVar1 = 0 < in_EDX && in_EDX < 0x10000;
  if (0 >= in_EDX || in_EDX >= 0x10000) {
    __assert_fail("height > 0 && height <= 0xFFFF",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x727,"int ImFontAtlas::AddCustomRectRegular(int, int)");
  }
  ImFontAtlasCustomRect::ImFontAtlasCustomRect(in_RDI);
  ImVector<ImFontAtlasCustomRect>::push_back
            ((ImVector<ImFontAtlasCustomRect> *)in_RDI,
             (ImFontAtlasCustomRect *)CONCAT17(uVar1,in_stack_ffffffffffffffb8));
  return (int)in_RDI[2].GlyphOffset.x + -1;
}

Assistant:

int ImFontAtlas::AddCustomRectRegular(int width, int height)
{
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    ImFontAtlasCustomRect r;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}